

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_COORD.cpp
# Opt level: O2

PP_COORD * __thiscall
PP_COORD::operator>(PP_COORD *__return_storage_ptr__,PP_COORD *this,PP_COORD *c)

{
  PP_COORD(__return_storage_ptr__);
  if (c->x <= this->x && this->x != c->x) {
    __return_storage_ptr__->x = 1.0;
  }
  if (c->y <= this->y && this->y != c->y) {
    __return_storage_ptr__->y = 1.0;
  }
  if (c->z <= this->z && this->z != c->z) {
    __return_storage_ptr__->z = 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

PP_COORD PP_COORD::operator> (PP_COORD const& c)
{
    PP_COORD b;//init to the null vector
    if(x>c.x) b.x=1.0;
    if(y>c.y) b.y=1.0;
    if(z>c.z) b.z=1.0;
    return b;
}